

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
          (CWriter *this,StackVar *t,char (*u) [4],char **args,char (*args_1) [2],
          ExternalInstancePtr *args_2,char (*args_3) [9],StackVar *args_4,char (*args_5) [2])

{
  string_view local_48;
  ExternalInstancePtr *local_38;
  ExternalInstancePtr *args_local_2;
  char (*args_local_1) [2];
  char **args_local;
  char (*u_local) [4];
  StackVar *t_local;
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (ExternalInstancePtr *)args_1;
  args_local_1 = (char (*) [2])args;
  args_local = (char **)u;
  u_local = (char (*) [4])t;
  t_local = (StackVar *)this;
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  Write<char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            (this,(char **)args_local_1,(char (*) [2])args_local_2,local_38,args_3,args_4,args_5);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }